

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::IfcSubContractResource
          (IfcSubContractResource *this)

{
  *(undefined ***)&this->field_0x1c8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1d0 = 0;
  *(char **)&this->field_0x1d8 = "IfcSubContractResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00779720);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x779618;
  *(undefined8 *)&this->field_0x1c8 = 0x779708;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x779640;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x779668;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x779690;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x7796b8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x7796e0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  (this->JobDescription).ptr._M_dataplus._M_p = (pointer)&(this->JobDescription).ptr.field_2;
  (this->JobDescription).ptr._M_string_length = 0;
  (this->JobDescription).ptr.field_2._M_local_buf[0] = '\0';
  (this->JobDescription).have = false;
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}